

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

GCstr * argv2str(jit_State *J,TValue *o)

{
  int iVar1;
  uint uVar2;
  jit_State *in_RSI;
  GCstr *s;
  undefined8 in_stack_ffffffffffffffa8;
  GCstr *local_40;
  lua_Number *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar1._0_1_ = (in_RSI->cur).marked;
  iVar1._1_1_ = (in_RSI->cur).gct;
  iVar1._2_1_ = (in_RSI->cur).topslot;
  iVar1._3_1_ = (in_RSI->cur).linktype;
  if (iVar1 == -5) {
    local_40 = (GCstr *)(ulong)(in_RSI->cur).nextgc.gcptr32;
  }
  else {
    uVar2._0_1_ = (in_RSI->cur).marked;
    uVar2._1_1_ = (in_RSI->cur).gct;
    uVar2._2_1_ = (in_RSI->cur).topslot;
    uVar2._3_1_ = (in_RSI->cur).linktype;
    if (0xfffeffff < uVar2) {
      lj_trace_err(in_RSI,(TraceError)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    }
    local_40 = lj_str_fromnum((lua_State *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffd8);
    (in_RSI->cur).nextgc.gcptr32 = (uint32_t)local_40;
    (in_RSI->cur).marked = 0xfb;
    (in_RSI->cur).gct = 0xff;
    (in_RSI->cur).topslot = 0xff;
    (in_RSI->cur).linktype = 0xff;
  }
  return local_40;
}

Assistant:

static GCstr *argv2str(jit_State *J, TValue *o)
{
  if (LJ_LIKELY(tvisstr(o))) {
    return strV(o);
  } else {
    GCstr *s;
    if (!tvisnumber(o))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    if (tvisint(o))
      s = lj_str_fromint(J->L, intV(o));
    else
      s = lj_str_fromnum(J->L, &o->n);
    setstrV(J->L, o, s);
    return s;
  }
}